

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O1

LY_ERR ly_write_(ly_out *out,char *buf,size_t len)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  size_t size;
  LY_ERR LVar6;
  
  if (out->hole_count == 0) {
    sVar2 = 0;
    do {
      switch(out->type) {
      case LY_OUT_FD:
        sVar4 = write((out->method).fd,buf,len);
        break;
      case LY_OUT_FDSTREAM:
      case LY_OUT_FILE:
      case LY_OUT_FILEPATH:
        sVar2 = fwrite(buf,1,len,(FILE *)(out->method).f);
        LVar6 = (uint)(sVar2 != len) * 2;
        goto LAB_0013bff8;
      case LY_OUT_MEMORY:
        pcVar1 = (out->method).fpath.filepath;
        pcVar3 = pcVar1 + len + 1;
        if ((char *)(out->method).mem.size < pcVar3) {
          pcVar1 = pcVar1 + (len - ((uint)pcVar3 & 0x3ff)) + 0x401;
          pcVar3 = (char *)ly_realloc(*(out->method).mem.buf,(size_t)pcVar1);
          *(out->method).mem.buf = pcVar3;
          if (*(out->method).mem.buf == (char *)0x0) {
            (out->method).fpath.filepath = (char *)0x0;
            (out->method).mem.size = 0;
            goto LAB_0013c063;
          }
          (out->method).mem.size = (size_t)pcVar1;
        }
        if (len != 0) {
          memcpy(*(out->method).mem.buf + (long)(out->method).fpath.filepath,buf,len);
        }
        pcVar1 = (out->method).fpath.filepath + len;
        (out->method).fpath.filepath = pcVar1;
        (*(out->method).mem.buf)[(long)pcVar1] = '\0';
        sVar2 = len;
        goto switchD_0013bf1a_default;
      case LY_OUT_CALLBACK:
        sVar4 = (*(out->method).clb.func)((out->method).fpath.filepath,buf,len);
        break;
      case LY_OUT_ERROR:
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x282)
        ;
        return LY_EINT;
      default:
switchD_0013bf1a_default:
        LVar6 = LY_SUCCESS;
        goto LAB_0013bff8;
      }
      if (-1 < (long)sVar4) {
        sVar2 = sVar4;
      }
      LVar6 = (LY_ERR)(sVar4 >> 0x3e) & ~LY_EMEM;
LAB_0013bff8:
      if (LVar6 == LY_SUCCESS) {
        if (len == sVar2) {
          LVar6 = LY_SUCCESS;
          if (out->type == LY_OUT_FDSTREAM) {
            LVar6 = LY_SUCCESS;
            lseek((out->method).fdstream.fd,0,2);
          }
        }
        else {
          LVar6 = LY_ESYS;
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
                 "%s: writing data failed (unable to write %u from %u data).","ly_write_",
                 (ulong)(uint)((int)len - (int)sVar2),(int)len);
        }
        goto LAB_0013c0b7;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 0xb);
    pcVar1 = strerror(*piVar5);
    sVar2 = 0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"%s: writing data failed (%s).","ly_write_",pcVar1);
LAB_0013c0b7:
    out->printed = out->printed + sVar2;
    out->func_printed = out->func_printed + sVar2;
  }
  else {
    size = out->buf_len + len;
    if (out->buf_size < size) {
      pcVar1 = (char *)ly_realloc(out->buffered,size);
      out->buffered = pcVar1;
      if (pcVar1 == (char *)0x0) {
        out->buf_len = 0;
        out->buf_size = 0;
LAB_0013c063:
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_write_");
        return LY_EMEM;
      }
      out->buf_size = out->buf_len + len;
    }
    if (len != 0) {
      memcpy(out->buffered + out->buf_len,buf,len);
    }
    out->buf_len = out->buf_len + len;
    out->printed = out->printed + len;
    out->func_printed = out->func_printed + len;
    LVar6 = LY_SUCCESS;
  }
  return LVar6;
}

Assistant:

LY_ERR
ly_write_(struct ly_out *out, const char *buf, size_t len)
{
    LY_ERR ret = LY_SUCCESS;
    size_t written = 0, new_mem_size;

    if (out->hole_count) {
        /* we are buffering data after a hole */
        if (out->buf_len + len > out->buf_size) {
            out->buffered = ly_realloc(out->buffered, out->buf_len + len);
            if (!out->buffered) {
                out->buf_len = 0;
                out->buf_size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->buf_size = out->buf_len + len;
        }

        if (len) {
            memcpy(&out->buffered[out->buf_len], buf, len);
        }
        out->buf_len += len;

        out->printed += len;
        out->func_printed += len;
        return LY_SUCCESS;
    }

repeat:
    switch (out->type) {
    case LY_OUT_MEMORY:
        new_mem_size = out->method.mem.len + len + 1;
        if (new_mem_size > out->method.mem.size) {
            new_mem_size = REALLOC_CHUNK(new_mem_size);
            *out->method.mem.buf = ly_realloc(*out->method.mem.buf, new_mem_size);
            if (!*out->method.mem.buf) {
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->method.mem.size = new_mem_size;
        }
        if (len) {
            memcpy(&(*out->method.mem.buf)[out->method.mem.len], buf, len);
        }
        out->method.mem.len += len;
        (*out->method.mem.buf)[out->method.mem.len] = '\0';

        written = len;
        break;
    case LY_OUT_FD: {
        ssize_t r;

        r = write(out->method.fd, buf, len);
        if (r < 0) {
            ret = LY_ESYS;
        } else {
            written = (size_t)r;
        }
        break;
    }
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
        written = fwrite(buf, sizeof *buf, len, out->method.f);
        if (written != len) {
            ret = LY_ESYS;
        }
        break;
    case LY_OUT_CALLBACK: {
        ssize_t r;

        r = out->method.clb.func(out->method.clb.arg, buf, len);
        if (r < 0) {
            ret = LY_ESYS;
        } else {
            written = (size_t)r;
        }
        break;
    }
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    }

    if (ret) {
        if ((errno == EAGAIN) || (errno == EWOULDBLOCK)) {
            ret = LY_SUCCESS;
            goto repeat;
        }
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (%s).", __func__, strerror(errno));
        written = 0;
    } else if (written != len) {
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (unable to write %" PRIu32 " from %" PRIu32 " data).", __func__,
                (uint32_t)(len - written), (uint32_t)len);
        ret = LY_ESYS;
    } else {
        if (out->type == LY_OUT_FDSTREAM) {
            /* move the original file descriptor to the end of the output file */
            lseek(out->method.fdstream.fd, 0, SEEK_END);
        }
        ret = LY_SUCCESS;
    }

    out->printed += written;
    out->func_printed += written;
    return ret;
}